

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void clearGlobals(void)

{
  if (g_type_void != (t_type *)0x0) {
    (*(g_type_void->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_string != (t_type *)0x0) {
    (*(g_type_string->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_bool != (t_type *)0x0) {
    (*(g_type_bool->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_i8 != (t_type *)0x0) {
    (*(g_type_i8->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_i16 != (t_type *)0x0) {
    (*(g_type_i16->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_i32 != (t_type *)0x0) {
    (*(g_type_i32->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_i64 != (t_type *)0x0) {
    (*(g_type_i64->super_t_doc)._vptr_t_doc[1])();
  }
  if (g_type_double != (t_type *)0x0) {
    (*(g_type_double->super_t_doc)._vptr_t_doc[1])();
  }
  return;
}

Assistant:

void clearGlobals() {
  delete g_type_void;
  delete g_type_string;
  delete g_type_bool;
  delete g_type_i8;
  delete g_type_i16;
  delete g_type_i32;
  delete g_type_i64;
  delete g_type_double;
}